

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict,xmlChar *prefix,xmlChar *name,int maybeLen,int update)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  xmlDictEntry *pxVar4;
  int *piVar5;
  bool bVar6;
  size_t local_a0;
  int *local_98;
  xmlDictEntry *cur;
  xmlDictEntry *end;
  uint pos;
  uint displ;
  uint mask;
  uint subHashValue;
  xmlDictEntry *subEntry;
  ulong uStack_68;
  int found;
  size_t klen;
  size_t plen;
  size_t len;
  size_t maxLen;
  uint newSize;
  uint hashValue;
  xmlChar *ret;
  xmlDictEntry *entry;
  int update_local;
  int maybeLen_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlDictPtr dict_local;
  
  ret = (xmlChar *)0x0;
  subEntry._4_4_ = 0;
  if ((dict == (xmlDictPtr)0x0) || (name == (xmlChar *)0x0)) {
    dict_local = (xmlDictPtr)0x0;
  }
  else {
    if (maybeLen < 0) {
      local_a0 = 0xffffffffffffffff;
    }
    else {
      local_a0 = (size_t)maybeLen;
    }
    len = local_a0;
    entry._0_4_ = update;
    entry._4_4_ = maybeLen;
    _update_local = name;
    name_local = prefix;
    prefix_local = (xmlChar *)dict;
    if (prefix == (xmlChar *)0x0) {
      maxLen._4_4_ = xmlDictHashName(dict->seed,name,local_a0,&plen);
      if (0x3fffffff < plen) {
        return (xmlDictEntry *)0x0;
      }
      uStack_68 = plen;
    }
    else {
      maxLen._4_4_ = xmlDictHashQName(dict->seed,prefix,name,&klen,&plen);
      if ((0x3fffffff < plen) || (0x3fffffff - plen <= klen)) {
        return (xmlDictEntry *)0x0;
      }
      uStack_68 = klen + 1 + plen;
    }
    if ((*(long *)(prefix_local + 0x38) == 0) || (uStack_68 < *(ulong *)(prefix_local + 0x38))) {
      if (*(long *)(prefix_local + 0x10) == 0) {
        maxLen._0_4_ = 8;
      }
      else {
        ret = (xmlChar *)
              xmlDictFindEntry((xmlDict *)prefix_local,name_local,_update_local,(int)uStack_68,
                               maxLen._4_4_,(int *)((long)&subEntry + 4));
        if (subEntry._4_4_ != 0) {
          return (xmlDictEntry *)ret;
        }
        if ((*(ulong *)(prefix_local + 0x10) >> 3) * 7 < (ulong)(*(int *)(prefix_local + 0x18) + 1))
        {
          if (0x7fffffff < *(ulong *)(prefix_local + 0x10)) {
            return (xmlDictEntry *)0x0;
          }
          maxLen._0_4_ = (uint)(*(long *)(prefix_local + 0x10) << 1);
        }
        else {
          maxLen._0_4_ = 0;
        }
      }
      if ((*(long *)(prefix_local + 0x28) != 0) &&
         (*(long *)(*(long *)(prefix_local + 0x28) + 0x10) != 0)) {
        if (name_local == (xmlChar *)0x0) {
          displ = xmlDictHashName(*(uint *)(*(long *)(prefix_local + 0x28) + 0x30),_update_local,
                                  plen,&plen);
        }
        else {
          displ = xmlDictHashQName(*(uint *)(*(long *)(prefix_local + 0x28) + 0x30),name_local,
                                   _update_local,&klen,&plen);
        }
        pxVar4 = xmlDictFindEntry(*(xmlDict **)(prefix_local + 0x28),name_local,_update_local,
                                  (int)uStack_68,displ,(int *)((long)&subEntry + 4));
        if (subEntry._4_4_ != 0) {
          return pxVar4;
        }
      }
      if ((int)entry == 0) {
        dict_local = (xmlDictPtr)0x0;
      }
      else {
        if ((uint)maxLen != 0) {
          iVar2 = xmlDictGrow((xmlDictPtr)prefix_local,(uint)maxLen);
          if (iVar2 != 0) {
            return (xmlDictEntry *)0x0;
          }
          uVar3 = (int)*(undefined8 *)(prefix_local + 0x10) - 1;
          end._4_4_ = 0;
          end._0_4_ = maxLen._4_4_ & uVar3;
          ret = (xmlChar *)(*(long *)(prefix_local + 8) + (ulong)(uint)end * 0x10);
          while( true ) {
            bVar6 = false;
            if (*(int *)ret != 0) {
              bVar6 = end._4_4_ <= ((uint)end - *(int *)ret & uVar3);
            }
            if (!bVar6) break;
            end._4_4_ = end._4_4_ + 1;
            end._0_4_ = (uint)end + 1;
            ret = ret + 0x10;
            if (((uint)end & uVar3) == 0) {
              ret = *(xmlChar **)(prefix_local + 8);
            }
          }
        }
        if (name_local == (xmlChar *)0x0) {
          _newSize = xmlDictAddString((xmlDictPtr)prefix_local,_update_local,(uint)plen);
        }
        else {
          _newSize = xmlDictAddQString((xmlDictPtr)prefix_local,name_local,(uint)klen,_update_local,
                                       (uint)plen);
        }
        if (_newSize == (xmlChar *)0x0) {
          dict_local = (xmlDictPtr)0x0;
        }
        else {
          if (*(int *)ret != 0) {
            piVar5 = (int *)(*(long *)(prefix_local + 8) + *(long *)(prefix_local + 0x10) * 0x10);
            local_98 = (int *)ret;
            do {
              local_98 = local_98 + 4;
              if (piVar5 <= local_98) {
                local_98 = *(int **)(prefix_local + 8);
              }
            } while (*local_98 != 0);
            if (local_98 < ret) {
              memmove((void *)(*(long *)(prefix_local + 8) + 0x10),*(void **)(prefix_local + 8),
                      (long)local_98 - *(long *)(prefix_local + 8));
              local_98 = piVar5 + -4;
              puVar1 = *(undefined8 **)(prefix_local + 8);
              *puVar1 = *(undefined8 *)local_98;
              puVar1[1] = *(undefined8 *)(piVar5 + -2);
            }
            memmove(ret + 0x10,ret,(long)local_98 - (long)ret);
          }
          *(uint *)ret = maxLen._4_4_;
          *(xmlChar **)(ret + 8) = _newSize;
          *(int *)(prefix_local + 0x18) = *(int *)(prefix_local + 0x18) + 1;
          dict_local = (xmlDictPtr)ret;
        }
      }
    }
    else {
      dict_local = (xmlDictPtr)0x0;
    }
  }
  return (xmlDictEntry *)dict_local;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static const xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict, const xmlChar *prefix,
                      const xmlChar *name, int maybeLen, int update) {
    xmlDictEntry *entry = NULL;
    const xmlChar *ret;
    unsigned hashValue, newSize;
    size_t maxLen, len, plen, klen;
    int found = 0;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    maxLen = (maybeLen < 0) ? SIZE_MAX : (size_t) maybeLen;

    if (prefix == NULL) {
        hashValue = xmlDictHashName(dict->seed, name, maxLen, &len);
        if (len > INT_MAX / 2)
            return(NULL);
        klen = len;
    } else {
        hashValue = xmlDictHashQName(dict->seed, prefix, name, &plen, &len);
        if ((len > INT_MAX / 2) || (plen >= INT_MAX / 2 - len))
            return(NULL);
        klen = plen + 1 + len;
    }

    if ((dict->limit > 0) && (klen >= dict->limit))
        return(NULL);

    /*
     * Check for an existing entry
     */
    if (dict->size == 0) {
        newSize = MIN_HASH_SIZE;
    } else {
        entry = xmlDictFindEntry(dict, prefix, name, klen, hashValue, &found);
        if (found)
            return(entry);

        if (dict->nbElems + 1 > dict->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
            if (dict->size >= MAX_HASH_SIZE)
                return(NULL);
            newSize = dict->size * 2;
        } else {
            newSize = 0;
        }
    }

    if ((dict->subdict != NULL) && (dict->subdict->size > 0)) {
        xmlDictEntry *subEntry;
        unsigned subHashValue;

        if (prefix == NULL)
            subHashValue = xmlDictHashName(dict->subdict->seed, name, len,
                                           &len);
        else
            subHashValue = xmlDictHashQName(dict->subdict->seed, prefix, name,
                                            &plen, &len);
        subEntry = xmlDictFindEntry(dict->subdict, prefix, name, klen,
                                    subHashValue, &found);
        if (found)
            return(subEntry);
    }

    if (!update)
        return(NULL);

    /*
     * Grow the hash table if needed
     */
    if (newSize > 0) {
        unsigned mask, displ, pos;

        if (xmlDictGrow(dict, newSize) != 0)
            return(NULL);

        /*
         * Find new entry
         */
        mask = dict->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &dict->table[pos];

        while ((entry->hashValue != 0) &&
               ((pos - entry->hashValue) & mask) >= displ) {
            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        }
    }

    if (prefix == NULL)
        ret = xmlDictAddString(dict, name, len);
    else
        ret = xmlDictAddQString(dict, prefix, plen, name, len);
    if (ret == NULL)
        return(NULL);

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlDictEntry *end = &dict->table[dict->size];
        const xmlDictEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = dict->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&dict->table[1], dict->table,
                    (char *) cur - (char *) dict->table);
            cur = end - 1;
            dict->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->hashValue = hashValue;
    entry->name = ret;

    dict->nbElems++;

    return(entry);
}